

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  cmComputeLinkInformation *this;
  cmLocalGenerator *this_00;
  ostream *poVar3;
  string *psVar4;
  pointer pIVar5;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_1f0;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_1e8;
  const_iterator li;
  ItemVector *deps;
  ostringstream local_1a8 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  cmComputeLinkInformation *info;
  string *config_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ifaceProperties_local;
  cmGeneratorTarget *target_local;
  
  this = cmGeneratorTarget::GetLinkInformation(target,config);
  if (this == (cmComputeLinkInformation *)0x0) {
    this_00 = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::operator<<((ostream *)local_1a8,"Exporting the target \"");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\" is not allowed since its linker language cannot be determined");
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,(string *)&deps);
    std::__cxx11::string::~string((string *)&deps);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    li._M_current = (Item *)cmComputeLinkInformation::GetItems(this);
    local_1e8._M_current =
         (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                          *)li._M_current);
    while( true ) {
      local_1f0._M_current =
           (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(li._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_1e8,&local_1f0);
      if (!bVar2) break;
      pIVar5 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_1e8);
      if (pIVar5->Target != (cmGeneratorTarget *)0x0) {
        pIVar5 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e8);
        pcVar1 = pIVar5->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,"COMPATIBLE_INTERFACE_BOOL",&local_211);
        getPropertyContents(pcVar1,&local_210,ifaceProperties);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        pIVar5 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e8);
        pcVar1 = pIVar5->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_238,"COMPATIBLE_INTERFACE_STRING",&local_239);
        getPropertyContents(pcVar1,&local_238,ifaceProperties);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
        pIVar5 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e8);
        pcVar1 = pIVar5->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_260,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_261);
        getPropertyContents(pcVar1,&local_260,ifaceProperties);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        pIVar5 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e8);
        pcVar1 = pIVar5->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_288,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_289);
        getPropertyContents(pcVar1,&local_288,ifaceProperties);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&local_1e8);
    }
  }
  return;
}

Assistant:

void getCompatibleInterfaceProperties(cmGeneratorTarget *target,
                                      std::set<std::string> &ifaceProperties,
                                      const std::string& config)
{
  cmComputeLinkInformation *info = target->GetLinkInformation(config);

  if (!info)
    {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName() << "\" is not "
        "allowed since its linker language cannot be determined";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  const cmComputeLinkInformation::ItemVector &deps = info->GetItems();

  for(cmComputeLinkInformation::ItemVector::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    if (!li->Target)
      {
      continue;
      }
    getPropertyContents(li->Target,
                        "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(li->Target,
                        "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(li->Target,
                        "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(li->Target,
                        "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
    }
}